

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::operator()(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this
            ,basic_string_view<char> value)

{
  format_specs *specs;
  buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  char *data;
  str_writer<char> local_40;
  
  __n = value.size_;
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar3 = sVar2 + __n;
    if (pbVar1->capacity_ < uVar3) {
      (**pbVar1->_vptr_buffer)(pbVar1,uVar3);
    }
    pbVar1->size_ = uVar3;
    if (__n != 0) {
      memmove(pbVar1->ptr_ + sVar2,value.data_,__n);
    }
  }
  else {
    if ((specs->type != '\0') && (specs->type != 's')) {
      error_handler::on_error((error_handler *)&local_40,"invalid type specifier");
    }
    uVar3 = (ulong)specs->precision;
    local_40.size_ = __n;
    if (uVar3 < __n) {
      local_40.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_40.size_ = __n;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this,specs,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }